

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

void __thiscall DyndepParserTestOutNoStatement::Run(DyndepParserTestOutNoStatement *this)

{
  Test *pTVar1;
  bool bVar2;
  string err;
  char kInput [48];
  DyndepParser parser;
  allocator<char> local_149;
  string local_148;
  string local_128;
  char local_108 [48];
  DyndepParser local_d8;
  
  builtin_strncpy(local_108 + 0x20,"issing: dyndep\n",0x10);
  builtin_strncpy(local_108 + 0x10,"sion = 1\nbuild m",0x10);
  builtin_strncpy(local_108,"ninja_dyndep_ver",0x10);
  DyndepParser::DyndepParser
            (&local_d8,&(this->super_DyndepParserTest).state_,
             (FileReader *)&(this->super_DyndepParserTest).fs_,
             &(this->super_DyndepParserTest).dyndep_file_);
  pTVar1 = g_current_test;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,local_108,&local_149);
  bVar2 = DyndepParser::ParseTest(&local_d8,&local_128,&local_148);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/dyndep_parser_test.cc"
             ,0xf2,"parser.ParseTest(kInput, &err)");
  std::__cxx11::string::~string((string *)&local_128);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:2: no build statement exists for \'missing\'\nbuild missing: dyndep\n             ^ near here"
                          ,&local_148);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/dyndep_parser_test.cc"
             ,0xf5,
             "\"input:2: no build statement exists for \'missing\'\\n\" \"build missing: dyndep\\n\" \"             ^ near here\" == err"
            );
  std::__cxx11::string::~string((string *)&local_148);
  DyndepParser::~DyndepParser(&local_d8);
  return;
}

Assistant:

TEST_F(DyndepParserTest, OutNoStatement) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build missing: dyndep\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:2: no build statement exists for 'missing'\n"
            "build missing: dyndep\n"
            "             ^ near here", err);
}